

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O0

bool __thiscall
units::precise_measurement::operator!=(precise_measurement *this,precise_measurement *other)

{
  bool bVar1;
  double local_40;
  precise_unit local_28;
  precise_measurement *local_18;
  precise_measurement *other_local;
  precise_measurement *this_local;
  
  local_18 = other;
  other_local = this;
  local_28 = units(other);
  bVar1 = precise_unit::operator==(&this->units_,&local_28);
  if (bVar1) {
    local_40 = value(local_18);
  }
  else {
    local_40 = value_as(local_18,&this->units_);
  }
  bVar1 = valueEqualityCheck(this,local_40);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool operator!=(const precise_measurement& other) const
    {
        return !valueEqualityCheck(
            (units_ == other.units()) ? other.value() : other.value_as(units_));
    }